

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::SumBatches::forward_impl
          (SumBatches *this,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  long in_RDX;
  Tensor *in_stack_000003c8;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_stack_000003d0;
  Device_CPU *in_stack_000003d8;
  SumBatches *in_stack_000003e0;
  
  if (*(long *)(in_RDX + 0x48) == 0) {
    __assert_fail("fx.device",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x7b2,
                  "virtual void dynet::SumBatches::forward_impl(const std::vector<const Tensor *> &, Tensor &) const"
                 );
  }
  if (*(int *)(*(long *)(in_RDX + 0x48) + 0xc) == 0) {
    forward_dev_impl<dynet::Device_CPU>
              (in_stack_000003e0,in_stack_000003d8,in_stack_000003d0,in_stack_000003c8);
    return;
  }
  abort();
}

Assistant:

void TraceOfProduct::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef __CUDACC__
  throw std::runtime_error("TraceOfProduct not yet implemented for CUDA");
#else
  auto x1 = **xs[0];
  auto x2 = **xs[1];
  fx.v[0] = (x1 * x2.transpose()).trace();
#endif
}